

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::requestTimeAsync(Federate *this,Time nextInternalTimeStep)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  char *__str;
  undefined8 uVar2;
  type *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  handle asyncInfo;
  Modes exp;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff58;
  future<TimeRepresentation<count_time<9,_long>_>_> *in_stack_ffffffffffffff68;
  Federate *in_stack_ffffffffffffff78;
  Time in_stack_ffffffffffffff80;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_48;
  undefined3 in_stack_ffffffffffffffdc;
  launch __policy;
  
  if (((ulong)in_RDI->_M_str & 0x1000000000000) != 0) {
    __str = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,__str);
    message._M_str = (char *)in_stack_ffffffffffffff80.internalTimeCode;
    message._M_len = (size_t)in_stack_ffffffffffffff78;
    InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_RDI,message);
    __cxa_throw(__str,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  __policy = CONCAT13(2,in_stack_ffffffffffffffdc);
  bVar1 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                    ((atomic<helics::Federate::Modes> *)in_stack_ffffffffffffff80.internalTimeCode,
                     (Modes *)in_stack_ffffffffffffff78,(Modes)((ulong)in_RDI >> 0x38),
                     (memory_order)in_RDI);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,(char *)in_stack_ffffffffffffff68);
    message_00._M_str = (char *)in_stack_ffffffffffffff80.internalTimeCode;
    message_00._M_len = (size_t)in_stack_ffffffffffffff78;
    InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_RDI,message_00);
    __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  preTimeRequestOperations
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,SUB81((ulong)in_RDI >> 0x38,0));
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                *)0x2578bc);
  gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
            (in_stack_ffffffffffffff58);
  std::async<helics::Federate::requestTimeAsync(TimeRepresentation<count_time<9,long>>)::__0>
            (__policy,in_RSI);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_48);
  std::future<TimeRepresentation<count_time<9,_long>_>_>::operator=
            ((future<TimeRepresentation<count_time<9,_long>_>_> *)in_RDI,in_stack_ffffffffffffff68);
  std::future<TimeRepresentation<count_time<9,_long>_>_>::~future
            ((future<TimeRepresentation<count_time<9,_long>_>_> *)0x25791b);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
            ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x257925);
  return;
}

Assistant:

void Federate::requestTimeAsync(Time nextInternalTimeStep)
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    auto exp = Modes::EXECUTING;
    if (currentMode.compare_exchange_strong(exp, Modes::PENDING_TIME)) {
        preTimeRequestOperations(nextInternalTimeStep, false);
        auto asyncInfo = asyncCallInfo->lock();
        asyncInfo->timeRequestFuture =
            std::async(std::launch::async, [this, nextInternalTimeStep]() {
                return coreObject->timeRequest(fedID, nextInternalTimeStep);
            });
    } else {
        throw(InvalidFunctionCall("cannot call request time in present state"));
    }
}